

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

primitive_dictionary_entry_t * __thiscall
duckdb::
PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>::
Lookup(PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
       *this,hugeint_t *value)

{
  bool bVar1;
  hugeint_t *in_RSI;
  long in_RDI;
  uint64_t offset;
  undefined1 local_31;
  undefined8 local_18;
  
  local_18 = duckdb::Hash<duckdb::hugeint_t>(*in_RSI);
  local_18 = local_18 & *(ulong *)(in_RDI + 0x20);
  while( true ) {
    bVar1 = primitive_dictionary_entry_t::IsEmpty
                      ((primitive_dictionary_entry_t *)(*(long *)(in_RDI + 0x90) + local_18 * 0x18))
    ;
    local_31 = 0;
    if (!bVar1) {
      local_31 = duckdb::hugeint_t::operator!=
                           ((hugeint_t *)(*(long *)(in_RDI + 0x90) + local_18 * 0x18),in_RSI);
    }
    if ((local_31 & 1) == 0) break;
    local_18 = *(ulong *)(in_RDI + 0x20) & local_18 + 1;
  }
  return (primitive_dictionary_entry_t *)(*(long *)(in_RDI + 0x90) + local_18 * 0x18);
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}